

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::RegisterTests
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest> *this)

{
  code *pcVar1;
  TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  *pTVar2;
  char *name;
  _Alloc_hider test_suite_name_00;
  _Alloc_hider value_param;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  pointer __lhs;
  undefined4 extraout_var;
  long *plVar8;
  undefined4 *puVar9;
  ostream *poVar10;
  size_type sVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer psVar12;
  size_type index;
  ulong uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  GTestLog local_1f0;
  int local_1ec;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e8;
  char *local_1e0;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>
  test_info;
  long local_1c8;
  string param_name;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  generator;
  string test_suite_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  long local_118;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string local_e0;
  CodeLocation local_c0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  CodeLocation local_58;
  long *plVar7;
  undefined4 extraout_var_00;
  
  psVar12 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar14 = false;
  do {
    if (psVar12 ==
        (this->tests_).
        super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (!bVar14) {
        iVar5 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [2])(this);
        CodeLocation::CodeLocation(&local_58,&this->code_location_);
        InsertSyntheticTestCase
                  ((string *)CONCAT44(extraout_var_03,iVar5),&local_58,
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_58);
      }
      return;
    }
    test_info.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (psVar12->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(psVar12->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount);
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      (*(code *)__lhs->generator)(&generator);
      pcVar1 = (code *)__lhs->name_func;
      local_1e0 = __lhs->file;
      local_1ec = __lhs->line;
      test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
      test_suite_name._M_string_length = 0;
      test_suite_name.field_2._M_local_buf[0] = '\0';
      if ((__lhs->name)._M_string_length != 0) {
        std::operator+(&local_158,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar5 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      plVar7 = (long *)CONCAT44(extraout_var,iVar5);
      local_1c8 = 0;
      while( true ) {
        iVar5 = (*(generator.impl_.
                   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
        plVar8 = (long *)CONCAT44(extraout_var_00,iVar5);
        if (plVar7 == plVar8) {
          bVar3 = 0;
        }
        else {
          bVar3 = (**(code **)(*plVar7 + 0x30))(plVar7,plVar8);
          bVar3 = bVar3 ^ 1;
        }
        if (plVar8 != (long *)0x0) {
          (**(code **)(*plVar8 + 8))(plVar8);
        }
        if (bVar3 == 0) break;
        Message::Message((Message *)&local_1e8);
        puVar9 = (undefined4 *)(**(code **)(*plVar7 + 0x28))(plVar7);
        local_158._M_dataplus._M_p._0_4_ = *puVar9;
        local_158._M_dataplus._M_p._4_4_ = puVar9[1];
        local_158._M_string_length._0_4_ = puVar9[2];
        local_158._M_string_length._4_4_ = puVar9[3];
        local_158.field_2._M_allocated_capacity._0_4_ = puVar9[4];
        local_158.field_2._M_allocated_capacity._4_4_ = puVar9[5];
        local_158.field_2._8_4_ = puVar9[6];
        local_158.field_2._12_4_ = puVar9[7];
        local_138 = puVar9[8];
        uStack_134 = puVar9[9];
        uStack_130 = puVar9[10];
        uStack_12c = puVar9[0xb];
        local_128 = puVar9[0xc];
        uStack_124 = puVar9[0xd];
        uStack_120 = puVar9[0xe];
        uStack_11c = puVar9[0xf];
        local_118 = local_1c8;
        (*pcVar1)(&param_name,&local_158);
        if (param_name._M_string_length == 0) {
          bVar14 = false;
        }
        else {
          for (uVar13 = 0; bVar14 = param_name._M_string_length <= uVar13, !bVar14;
              uVar13 = uVar13 + 1) {
            bVar4 = IsAlNum(param_name._M_dataplus._M_p[uVar13]);
            if ((!bVar4) && (param_name._M_dataplus._M_p[uVar13] != '_')) break;
          }
        }
        bVar14 = IsTrue(bVar14);
        if (!bVar14) {
          GTestLog::GTestLog((GTestLog *)&local_158,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x246);
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "Condition IsValidParamName(param_name) failed. ");
          poVar10 = std::operator<<(poVar10,"Parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)&param_name);
          poVar10 = std::operator<<(poVar10,"\' is invalid, in ");
          poVar10 = std::operator<<(poVar10,local_1e0);
          poVar10 = std::operator<<(poVar10," line ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_1ec);
          std::endl<char,std::char_traits<char>>(poVar10);
          GTestLog::~GTestLog((GTestLog *)&local_158);
        }
        sVar11 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&test_param_names,&param_name);
        bVar14 = IsTrue(sVar11 == 0);
        if (!bVar14) {
          GTestLog::GTestLog((GTestLog *)&local_158,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24a);
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar10 = std::operator<<(poVar10,"Duplicate parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)&param_name);
          poVar10 = std::operator<<(poVar10,"\', in ");
          poVar10 = std::operator<<(poVar10,local_1e0);
          poVar10 = std::operator<<(poVar10," line ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_1ec);
          std::endl<char,std::char_traits<char>>(poVar10);
          GTestLog::~GTestLog((GTestLog *)&local_158);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        if (((test_info.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->test_base_name)._M_string_length != 0) {
          std::operator<<((ostream *)(local_1e8._M_head_impl + 0x10),
                          (string *)
                          &(test_info.
                            super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->test_base_name);
          std::operator<<((ostream *)(local_1e8._M_head_impl + 0x10),"/");
        }
        std::operator<<((ostream *)(local_1e8._M_head_impl + 0x10),(string *)&param_name);
        test_suite_name_00 = test_suite_name._M_dataplus;
        Message::GetString_abi_cxx11_(&local_158,(Message *)&local_1e8);
        name = (char *)CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_);
        auVar15 = (**(code **)(*plVar7 + 0x28))(plVar7);
        PrintToString<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::TestVideoParam,std::tuple<int,int>>>
                  (&local_e0,auVar15._0_8_,auVar15._8_8_);
        value_param._M_p = local_e0._M_dataplus._M_p;
        CodeLocation::CodeLocation
                  (&local_c0,
                   &(test_info.
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->code_location);
        iVar5 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        bVar14 = IsTrue(true);
        if (!bVar14) {
          GTestLog::GTestLog(&local_1f0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x20e);
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar10 = std::operator<<(poVar10,
                                    "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                   );
          poVar10 = std::operator<<(poVar10,local_1e0);
          poVar10 = std::operator<<(poVar10,":");
          std::ostream::operator<<(poVar10,local_1ec);
          GTestLog::~GTestLog(&local_1f0);
        }
        bVar14 = IsTrue(true);
        if (!bVar14) {
          GTestLog::GTestLog(&local_1f0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x223);
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar10 = std::operator<<(poVar10,
                                    "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                   );
          poVar10 = std::operator<<(poVar10,local_1e0);
          poVar10 = std::operator<<(poVar10,":");
          std::ostream::operator<<(poVar10,local_1ec);
          GTestLog::~GTestLog(&local_1f0);
        }
        pTVar2 = ((test_info.
                   super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>_*,_false>
                 ._M_head_impl;
        puVar9 = (undefined4 *)(**(code **)(*plVar7 + 0x28))();
        local_98 = *puVar9;
        uStack_94 = puVar9[1];
        uStack_90 = puVar9[2];
        uStack_8c = puVar9[3];
        local_88 = puVar9[4];
        uStack_84 = puVar9[5];
        uStack_80 = puVar9[6];
        uStack_7c = puVar9[7];
        local_78 = puVar9[8];
        uStack_74 = puVar9[9];
        uStack_70 = puVar9[10];
        uStack_6c = puVar9[0xb];
        local_68 = puVar9[0xc];
        uStack_64 = puVar9[0xd];
        uStack_60 = puVar9[0xe];
        uStack_5c = puVar9[0xf];
        iVar6 = (*pTVar2->_vptr_TestMetaFactoryBase[2])(pTVar2,&local_98);
        MakeAndRegisterTestInfo
                  (test_suite_name_00._M_p,name,(char *)0x0,value_param._M_p,&local_c0,
                   (TypeId)CONCAT44(extraout_var_01,iVar5),(SetUpTestSuiteFunc)0x0,
                   (TearDownTestSuiteFunc)0x0,(TestFactoryBase *)CONCAT44(extraout_var_02,iVar6));
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&param_name);
        if (local_1e8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1e8._M_head_impl + 8))();
        }
        (**(code **)(*plVar7 + 0x18))(plVar7);
        local_1c8 = local_1c8 + 1;
        bVar14 = true;
      }
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 8))();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__cxx11::string::~string((string *)&test_suite_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    psVar12 = psVar12 + 1;
  } while( true );
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }